

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

Float __thiscall pbrt::ParameterDictionary::UpgradeBlackbody(ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar6;
  float local_34;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar6 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar6 = paVar1;
  }
  if (sVar2 == 0) {
    local_34 = 1.0;
  }
  else {
    local_34 = 1.0;
    lVar5 = 0;
    do {
      pcVar3 = *(char **)((long)paVar6 + lVar5);
      __n = *(size_t *)(pcVar3 + 0x28);
      if ((__n == name->_M_string_length) &&
         (((__n == 0 ||
           (iVar4 = bcmp(*(void **)(pcVar3 + 0x20),(name->_M_dataplus)._M_p,__n), iVar4 == 0)) &&
          (iVar4 = std::__cxx11::string::compare(pcVar3), iVar4 == 0)))) {
        if (*(long *)(pcVar3 + 0x70) != 2) {
          ErrorExit((FileLoc *)(pcVar3 + 0x40),
                    "Expected two values for legacy \"blackbody\" parameter.");
        }
        local_34 = (float)((double)local_34 * *(double *)(*(long *)(pcVar3 + 0x60) + 8));
        pcVar3[0x70] = '\x01';
        pcVar3[0x71] = '\0';
        pcVar3[0x72] = '\0';
        pcVar3[0x73] = '\0';
        pcVar3[0x74] = '\0';
        pcVar3[0x75] = '\0';
        pcVar3[0x76] = '\0';
        pcVar3[0x77] = '\0';
      }
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  return local_34;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}